

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O2

void easysrc_free(void)

{
  curl_slist_free_all(easysrc_decl);
  easysrc_decl = (curl_slist *)0x0;
  curl_slist_free_all(easysrc_data);
  easysrc_data = (curl_slist *)0x0;
  curl_slist_free_all(easysrc_code);
  easysrc_code = (curl_slist *)0x0;
  curl_slist_free_all(easysrc_toohard);
  easysrc_toohard = (curl_slist *)0x0;
  curl_slist_free_all(easysrc_clean);
  easysrc_clean = (curl_slist *)0x0;
  return;
}

Assistant:

static void easysrc_free(void)
{
  curl_slist_free_all(easysrc_decl);
  easysrc_decl = NULL;
  curl_slist_free_all(easysrc_data);
  easysrc_data = NULL;
  curl_slist_free_all(easysrc_code);
  easysrc_code = NULL;
  curl_slist_free_all(easysrc_toohard);
  easysrc_toohard = NULL;
  curl_slist_free_all(easysrc_clean);
  easysrc_clean = NULL;
}